

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O1

size_t __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:56:51)>
::anon_class_16_2_928cd080_for_func::operator()
          (anon_class_16_2_928cd080_for_func *this,size_t result)

{
  char *pcVar1;
  size_t sVar2;
  char (*in_RCX) [32];
  String local_1c8;
  Exception local_1b0;
  
  if (result < this->minBytes) {
    Debug::makeDescription<char_const(&)[32]>
              (&local_1c8,(Debug *)"\"stream disconnected prematurely\"",
               "stream disconnected prematurely",in_RCX);
    Exception::Exception
              (&local_1b0,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c,&local_1c8);
    throwRecoverableException(&local_1b0,0);
    Exception::~Exception(&local_1b0);
    sVar2 = local_1c8.content.size_;
    pcVar1 = local_1c8.content.ptr;
    if (local_1c8.content.ptr != (char *)0x0) {
      local_1c8.content.ptr = (char *)0x0;
      local_1c8.content.size_ = 0;
      (**(local_1c8.content.disposer)->_vptr_ArrayDisposer)
                (local_1c8.content.disposer,pcVar1,1,sVar2,sVar2,0);
    }
    memset((void *)((long)this->buffer + result),0,this->minBytes - result);
    result = this->minBytes;
  }
  return result;
}

Assistant:

Promise<size_t> AsyncInputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  return tryRead(buffer, minBytes, maxBytes).then([=](size_t result) {
    if (result >= minBytes) {
      return result;
    } else {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      // Pretend we read zeros from the input.
      memset(reinterpret_cast<byte*>(buffer) + result, 0, minBytes - result);
      return minBytes;
    }
  });
}